

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

string * __thiscall
LinearSystem::SwapMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream out;
  allocator<char> local_190 [376];
  
  bVar1 = IsEmpty(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    bVar1 = this->first_row_ != this->second_row_;
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)local_190,"Swap rows: ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->first_row_);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<((ostream *)poVar2,this->second_row_);
    }
    if (this->first_main_column_ != this->second_main_column_) {
      if (bVar1) {
        std::endl<char,std::char_traits<char>>((ostream *)local_190);
      }
      poVar2 = std::operator<<((ostream *)local_190,"Swap column: ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->first_main_column_);
      poVar2 = std::operator<<(poVar2," ");
      bVar1 = true;
      std::ostream::operator<<((ostream *)poVar2,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar1) {
        std::endl<char,std::char_traits<char>>((ostream *)local_190);
      }
      poVar2 = std::operator<<((ostream *)local_190,"Swap column: ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->first_extension_column_);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<((ostream *)poVar2,this->second_extension_column_);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToString() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  if (first_row_ != second_row_) {
    started = true;
    out << "Swap rows: " << first_row_  << " " << second_row_;
  }
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << std::endl;
    }
    started = true;
    out << "Swap column: " << first_main_column_ << " " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << std::endl;
    }
    out << "Swap column: " << first_extension_column_ << " " << second_extension_column_;
  }

  return out.str();
}